

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_e03746::TransformSelectorFor::TransformSelectorFor
          (TransformSelectorFor *this,index_type start,index_type stop,index_type step)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *local_50;
  size_type local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"FOR","");
  (this->super_TransformSelectorIndexes).super_TransformSelector.super_TransformSelector.
  _vptr_TransformSelector = (_func_int **)&PTR__TransformSelector_00bdc2b0;
  paVar1 = &(this->super_TransformSelectorIndexes).super_TransformSelector.Tag.field_2;
  (this->super_TransformSelectorIndexes).super_TransformSelector.Tag._M_dataplus._M_p =
       (pointer)paVar1;
  if (local_50 == &local_40) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_3f,local_40);
    *(undefined8 *)
     ((long)&(this->super_TransformSelectorIndexes).super_TransformSelector.Tag.field_2 + 8) =
         uStack_38;
  }
  else {
    (this->super_TransformSelectorIndexes).super_TransformSelector.Tag._M_dataplus._M_p = local_50;
    (this->super_TransformSelectorIndexes).super_TransformSelector.Tag.field_2._M_allocated_capacity
         = CONCAT71(uStack_3f,local_40);
  }
  (this->super_TransformSelectorIndexes).super_TransformSelector.Tag._M_string_length = local_48;
  (this->super_TransformSelectorIndexes).super_TransformSelector.super_TransformSelector.
  _vptr_TransformSelector = (_func_int **)&PTR__TransformSelectorIndexes_00bdc370;
  (this->super_TransformSelectorIndexes).Indexes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TransformSelectorIndexes).Indexes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_TransformSelectorIndexes).Indexes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_TransformSelectorIndexes).super_TransformSelector.super_TransformSelector.
  _vptr_TransformSelector = (_func_int **)&PTR__TransformSelectorIndexes_00bdc3b0;
  this->Start = start;
  this->Stop = stop;
  this->Step = step;
  return;
}

Assistant:

TransformSelectorFor(index_type start, index_type stop, index_type step)
    : TransformSelectorIndexes("FOR")
    , Start(start)
    , Stop(stop)
    , Step(step)
  {
  }